

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O3

Abc_Obj_t *
Abc_NodeFromIf_rec(Abc_Ntk_t *pNtkNew,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Int_t *vCover)

{
  If_Cut_t *pCut;
  byte bVar1;
  If_Obj_t *pIVar2;
  Vec_Mem_t *pVVar3;
  void *pvVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Abc_Obj_t *pAVar9;
  If_Par_t *pIVar10;
  Abc_Obj_t *pAVar11;
  word *pwVar12;
  int *pArrTimeProfile;
  DdNode *n;
  uint *puTruth;
  char *pcVar13;
  Hop_Obj_t *pHVar14;
  word *pwVar15;
  long lVar16;
  ulong uVar17;
  Vec_Ptr_t *pVVar18;
  uint iVar;
  DdManager *dd;
  Hop_Man_t *pHVar19;
  ulong uVar20;
  Abc_Obj_t *pFanins [15];
  Abc_Obj_t *local_a8 [15];
  
  if ((Abc_Obj_t *)(pIfObj->field_22).pCopy != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)(pIfObj->field_22).pCopy;
  }
  if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) != (undefined1  [112])0x4) {
    __assert_fail("pIfObj->Type == IF_AND",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                  ,0x1be,
                  "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)")
    ;
  }
  pCut = &pIfObj->CutBest;
  if (pIfMan->pPars->fUserSesLib != 0) {
    uVar8 = *(uint *)&(pIfObj->CutBest).field_0x1c;
    uVar17 = (ulong)(uVar8 >> 0x18);
    if (0xffffff < uVar8) {
      uVar20 = 0;
      do {
        iVar7 = *(int *)(&pIfObj[1].field_0x0 + uVar20 * 4);
        if (((long)iVar7 < 0) || (pIfMan->vObjs->nSize <= iVar7)) goto LAB_002d4a9f;
        pIVar2 = (If_Obj_t *)pIfMan->vObjs->pArray[iVar7];
        if (pIVar2 == (If_Obj_t *)0x0) break;
        pAVar9 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIVar2,vCover);
        local_a8[uVar20] = pAVar9;
        uVar20 = uVar20 + 1;
        uVar17 = (ulong)(byte)(pIfObj->CutBest).field_0x1f;
      } while (uVar20 < uVar17);
    }
    uVar8 = (pIfObj->CutBest).iCutFunc;
    if (-1 < (int)uVar8) {
      pwVar15 = pIfMan->puTempW;
      pVVar3 = pIfMan->vTtMem[uVar17];
      if (pVVar3 == (Vec_Mem_t *)0x0) {
        pwVar12 = (word *)0x0;
      }
      else {
        uVar6 = uVar8 >> 1;
        if (pVVar3->nEntries <= (int)uVar6) goto LAB_002d4afc;
        pwVar12 = pVVar3->ppPages[uVar6 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
                  (ulong)(uVar6 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
      }
      uVar6 = pIfMan->nTruth6Words[uVar17];
      if ((uVar8 & 1) == 0) {
        if (0 < (int)uVar6) {
          uVar17 = 0;
          do {
            pwVar15[uVar17] = pwVar12[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar6 != uVar17);
        }
      }
      else if (0 < (int)uVar6) {
        uVar17 = 0;
        do {
          pwVar15[uVar17] = ~pwVar12[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar6 != uVar17);
      }
      bVar1 = (pIfObj->CutBest).field_0x1f;
      pArrTimeProfile = If_CutArrTimeProfile(pIfMan,pCut);
      pAVar9 = Abc_ExactBuildNode(pwVar15,(uint)bVar1,pArrTimeProfile,local_a8,pNtkNew);
      (pIfObj->field_22).pCopy = pAVar9;
      return pAVar9;
    }
LAB_002d4add:
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                  ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  pAVar9 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
  pIVar10 = pIfMan->pPars;
  if ((((pIVar10->fDelayOpt == 0) && (pIVar10->fDelayOptLut == 0)) && (pIVar10->fDsdBalance == 0))
     && (((pIVar10->fUseTtPerm == 0 && (pIVar10->pLutStruct == (char *)0x0)) &&
         ((pIVar10->fUserRecLib == 0 && ((pIVar10->fUserSesLib == 0 && (pIVar10->nGateSize == 0)))))
         ))) {
    If_CutRotatePins(pIfMan,pCut);
    pIVar10 = pIfMan->pPars;
  }
  if ((pIVar10->fUseCnfs == 0) && (pIVar10->fUseMv == 0)) {
    if (0xffffff < *(uint *)&(pIfObj->CutBest).field_0x1c) {
      uVar17 = 0;
      do {
        iVar7 = *(int *)(&pIfObj[1].field_0x0 + uVar17 * 4);
        if (((long)iVar7 < 0) || (pIfMan->vObjs->nSize <= iVar7)) goto LAB_002d4a9f;
        pIVar2 = (If_Obj_t *)pIfMan->vObjs->pArray[iVar7];
        if (pIVar2 == (If_Obj_t *)0x0) break;
        pAVar11 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIVar2,vCover);
        Abc_ObjAddFanin(pAVar9,pAVar11);
        uVar17 = uVar17 + 1;
      } while (uVar17 < (byte)(pIfObj->CutBest).field_0x1f);
    }
  }
  else {
    uVar8 = *(uint *)&(pIfObj->CutBest).field_0x1c;
    if (0xffffff < uVar8) {
      uVar17 = (ulong)(uVar8 >> 0x18);
      do {
        iVar7 = *(int *)(&(pIfObj->CutBest).field_0x1c + uVar17 * 4);
        if (((long)iVar7 < 0) || (pIfMan->vObjs->nSize <= iVar7)) goto LAB_002d4a9f;
        pIVar2 = (If_Obj_t *)pIfMan->vObjs->pArray[iVar7];
        if (pIVar2 == (If_Obj_t *)0x0) break;
        pAVar11 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIVar2,vCover);
        Abc_ObjAddFanin(pAVar9,pAVar11);
        bVar5 = 1 < uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar5);
    }
  }
  iVar7 = Abc_ObjLevelNew(pAVar9);
  *(uint *)&pAVar9->field_0x14 = *(uint *)&pAVar9->field_0x14 & 0xfff | iVar7 << 0xc;
  pIVar10 = pIfMan->pPars;
  if (pIVar10->fTruth == 0) {
    if (*(uint *)&(pIfObj->CutBest).field_0x1c < 0x2000000) {
      __assert_fail("pCut->nLeaves > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                    ,0x286,"Hop_Obj_t *Abc_NodeIfToHop(Hop_Man_t *, If_Man_t *, If_Obj_t *)");
    }
    pHVar19 = (Hop_Man_t *)pNtkNew->pManFunc;
    uVar17 = 0;
    do {
      iVar7 = *(int *)(&pIfObj[1].field_0x0 + uVar17 * 4);
      if (((long)iVar7 < 0) || (pIfMan->vObjs->nSize <= iVar7)) goto LAB_002d4a9f;
      pvVar4 = pIfMan->vObjs->pArray[iVar7];
      if (pvVar4 == (void *)0x0) break;
      pHVar14 = Hop_IthVar(pHVar19,(int)uVar17);
      *(Hop_Obj_t **)((long)pvVar4 + 0x50) = pHVar14;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (byte)(pIfObj->CutBest).field_0x1f);
    pVVar18 = pIfMan->vTemp;
    pVVar18->nSize = 0;
    pHVar14 = Abc_NodeIfToHop2_rec(pHVar19,pIfMan,pIfObj,pVVar18);
    if (pHVar14 == (Hop_Obj_t *)0x1) {
      puts("Abc_NodeIfToHop(): Computing local AIG has failed.");
      pHVar14 = (Hop_Obj_t *)0x0;
    }
    else {
      if (0xffffff < *(uint *)&(pIfObj->CutBest).field_0x1c) {
        uVar17 = 0;
        do {
          iVar7 = *(int *)(&pIfObj[1].field_0x0 + uVar17 * 4);
          if (((long)iVar7 < 0) || (pIfMan->vObjs->nSize <= iVar7)) {
LAB_002d4a9f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar4 = pIfMan->vObjs->pArray[iVar7];
          if (pvVar4 == (void *)0x0) break;
          *(undefined8 *)((long)pvVar4 + 0x50) = 0;
          uVar17 = uVar17 + 1;
        } while (uVar17 < (byte)(pIfObj->CutBest).field_0x1f);
      }
      pVVar18 = pIfMan->vTemp;
      if (0 < pVVar18->nSize) {
        lVar16 = 0;
        do {
          *(undefined8 *)pVVar18->pArray[lVar16] = 0;
          lVar16 = lVar16 + 1;
          pVVar18 = pIfMan->vTemp;
        } while (lVar16 < pVVar18->nSize);
      }
    }
    (pAVar9->field_5).pData = pHVar14;
    goto LAB_002d48e6;
  }
  if (pIVar10->fUseBdds == 0) {
    if ((pIVar10->fUseCnfs != 0) || (pIVar10->fUseMv != 0)) {
      uVar8 = (pIfObj->CutBest).iCutFunc;
      if ((int)uVar8 < 0) goto LAB_002d4add;
      dd = (DdManager *)pNtkNew->pManFunc;
      pwVar15 = pIfMan->puTempW;
      bVar1 = (pIfObj->CutBest).field_0x1f;
      pVVar3 = pIfMan->vTtMem[bVar1];
      if (pVVar3 == (Vec_Mem_t *)0x0) {
        pwVar12 = (word *)0x0;
      }
      else {
        uVar6 = uVar8 >> 1;
        if (pVVar3->nEntries <= (int)uVar6) goto LAB_002d4afc;
        pwVar12 = pVVar3->ppPages[uVar6 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
                  (ulong)(uVar6 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
      }
      uVar6 = pIfMan->nTruth6Words[bVar1];
      if ((uVar8 & 1) == 0) {
        if (0 < (int)uVar6) {
          uVar17 = 0;
          do {
            pwVar15[uVar17] = pwVar12[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar6 != uVar17);
        }
      }
      else if (0 < (int)uVar6) {
        uVar17 = 0;
        do {
          pwVar15[uVar17] = ~pwVar12[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar6 != uVar17);
      }
      bVar1 = (pIfObj->CutBest).field_0x1f;
      iVar7 = 1;
      goto LAB_002d48b7;
    }
    if ((pIVar10->fUseSops == 0) && (pIVar10->nGateSize < 1)) {
      if (pIVar10->fDelayOpt == 0) {
        if (pIVar10->fDsdBalance != 0) {
          pHVar19 = (Hop_Man_t *)pNtkNew->pManFunc;
          iVar7 = 1;
          goto LAB_002d49ea;
        }
        if (pIVar10->fUserRecLib == 0) {
          pwVar15 = If_CutTruthW(pIfMan,pCut);
          uVar8 = *(uint *)&(pIfObj->CutBest).field_0x1c;
          if (0xffffff < uVar8 && pIfMan->pPars->fUseTtPerm != 0) {
            uVar6 = uVar8 >> 0x18;
            iVar = 0;
            do {
              if (((uint)(pIfObj->CutBest).uMaskFunc >> (iVar & 0x1f) & 1) != 0) {
                iVar7 = 1 << ((char)uVar6 - 6U & 0x1f);
                if (uVar8 < 0x7000000) {
                  iVar7 = 1;
                }
                Abc_TtFlip(pwVar15,iVar7,iVar);
                uVar8 = *(uint *)&(pIfObj->CutBest).field_0x1c;
              }
              iVar = iVar + 1;
              uVar6 = uVar8 >> 0x18;
            } while (iVar < uVar6);
          }
          pHVar14 = Kit_TruthToHop((Hop_Man_t *)pNtkNew->pManFunc,(uint *)pwVar15,uVar8 >> 0x18,
                                   vCover);
        }
        else {
          pHVar14 = Abc_RecToHop3((Hop_Man_t *)pNtkNew->pManFunc,pIfMan,pCut,pIfObj);
        }
      }
      else {
        pHVar19 = (Hop_Man_t *)pNtkNew->pManFunc;
        iVar7 = 0;
LAB_002d49ea:
        pHVar14 = Abc_NodeBuildFromMini(pHVar19,pIfMan,pCut,iVar7);
      }
      (pAVar9->field_5).pData = pHVar14;
    }
    else {
      puTruth = If_CutTruth(pIfMan,pCut);
      uVar8 = Kit_TruthIsop(puTruth,(uint)(byte)(pIfObj->CutBest).field_0x1f,vCover,1);
      if (1 < uVar8) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                      ,0x1f2,
                      "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)"
                     );
      }
      if ((vCover->nSize == 0) || ((vCover->nSize == 1 && (*vCover->pArray == 0)))) {
        if (uVar8 != 0) {
          __assert_fail("RetValue == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                        ,0x1f6,
                        "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)"
                       );
        }
        pcVar13 = Abc_SopCreateAnd((Mem_Flex_t *)pNtkNew->pManFunc,
                                   (uint)(byte)(pIfObj->CutBest).field_0x1f,(int *)0x0);
        (pAVar9->field_5).pData = pcVar13;
        if (vCover->nSize == 0) {
          pAVar9 = Abc_NtkCreateNodeConst0(pNtkNew);
        }
        else {
          pAVar9 = Abc_NtkCreateNodeConst1(pNtkNew);
        }
      }
      else {
        pcVar13 = Abc_SopCreateFromIsop
                            ((Mem_Flex_t *)pNtkNew->pManFunc,
                             (uint)(byte)(pIfObj->CutBest).field_0x1f,vCover);
        (pAVar9->field_5).pData = pcVar13;
        if (uVar8 != 0) {
          Abc_SopComplement(pcVar13);
        }
      }
    }
  }
  else {
    uVar8 = (pIfObj->CutBest).iCutFunc;
    if ((int)uVar8 < 0) goto LAB_002d4add;
    dd = (DdManager *)pNtkNew->pManFunc;
    pwVar15 = pIfMan->puTempW;
    bVar1 = (pIfObj->CutBest).field_0x1f;
    pVVar3 = pIfMan->vTtMem[bVar1];
    if (pVVar3 == (Vec_Mem_t *)0x0) {
      pwVar12 = (word *)0x0;
    }
    else {
      uVar6 = uVar8 >> 1;
      if (pVVar3->nEntries <= (int)uVar6) {
LAB_002d4afc:
        __assert_fail("i >= 0 && i < p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
      }
      pwVar12 = pVVar3->ppPages[uVar6 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
                (ulong)(uVar6 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
    }
    uVar6 = pIfMan->nTruth6Words[bVar1];
    if ((uVar8 & 1) == 0) {
      if (0 < (int)uVar6) {
        uVar17 = 0;
        do {
          pwVar15[uVar17] = pwVar12[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar6 != uVar17);
      }
    }
    else if (0 < (int)uVar6) {
      uVar17 = 0;
      do {
        pwVar15[uVar17] = ~pwVar12[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar6 != uVar17);
    }
    bVar1 = (pIfObj->CutBest).field_0x1f;
    iVar7 = 0;
LAB_002d48b7:
    n = Kit_TruthToBdd(dd,(uint *)pwVar15,(uint)bVar1,iVar7);
    (pAVar9->field_5).pData = n;
    Cudd_Ref(n);
  }
  if (((((pIfObj->CutBest).field_0x1d & 0x10) != 0) && (pIfMan->pPars->fDelayOpt == 0)) &&
     (pIfMan->pPars->fDsdBalance == 0)) {
    Abc_NodeComplement(pAVar9);
  }
LAB_002d48e6:
  (pIfObj->field_22).pCopy = pAVar9;
  return pAVar9;
}

Assistant:

Abc_Obj_t * Abc_NodeFromIf_rec( Abc_Ntk_t * pNtkNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vCover )
{
    Abc_Obj_t * pNodeNew;
    If_Cut_t * pCutBest;
    If_Obj_t * pIfLeaf;
    int i;
    // return if the result if known
    pNodeNew = (Abc_Obj_t *)If_ObjCopy( pIfObj );
    if ( pNodeNew )
        return pNodeNew;
    assert( pIfObj->Type == IF_AND );
    // get the parameters of the best cut
    pCutBest = If_ObjCutBest( pIfObj );
    if ( pIfMan->pPars->fUserSesLib )
    {
        // create the subgraph composed of Abc_Obj_t nodes based on the given cut
        Abc_Obj_t * pFanins[IF_MAX_FUNC_LUTSIZE];
        If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, i )
            pFanins[i] = Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover);
        pNodeNew = Abc_ExactBuildNode( If_CutTruthW(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), If_CutArrTimeProfile(pIfMan, pCutBest), pFanins, pNtkNew );
        If_ObjSetCopy( pIfObj, pNodeNew );
        return pNodeNew;
    }
    // create a new node 
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
//    if ( pIfMan->pPars->pLutLib && pIfMan->pPars->pLutLib->fVarPinDelays )
    if ( !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDelayOptLut && !pIfMan->pPars->fDsdBalance && !pIfMan->pPars->fUseTtPerm && 
         !pIfMan->pPars->pLutStruct && !pIfMan->pPars->fUserRecLib && !pIfMan->pPars->fUserSesLib && !pIfMan->pPars->nGateSize )
        If_CutRotatePins( pIfMan, pCutBest );
    if ( pIfMan->pPars->fUseCnfs || pIfMan->pPars->fUseMv )
    {
        If_CutForEachLeafReverse( pIfMan, pCutBest, pIfLeaf, i )
            Abc_ObjAddFanin( pNodeNew, Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover) );
    }
    else
    {
        If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, i )
            Abc_ObjAddFanin( pNodeNew, Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover) );
    }
    // set the level of the new node
    pNodeNew->Level = Abc_ObjLevelNew( pNodeNew );
    // derive the function of this node
    if ( pIfMan->pPars->fTruth )
    {
        if ( pIfMan->pPars->fUseBdds )
        { 
            // transform truth table into the BDD 
#ifdef ABC_USE_CUDD
            pNodeNew->pData = Kit_TruthToBdd( (DdManager *)pNtkNew->pManFunc, If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), 0 );  Cudd_Ref((DdNode *)pNodeNew->pData); 
#endif
        }
        else if ( pIfMan->pPars->fUseCnfs || pIfMan->pPars->fUseMv )
        { 
            // transform truth table into the BDD 
#ifdef ABC_USE_CUDD
            pNodeNew->pData = Kit_TruthToBdd( (DdManager *)pNtkNew->pManFunc, If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), 1 );  Cudd_Ref((DdNode *)pNodeNew->pData); 
#endif
        }
        else if ( pIfMan->pPars->fUseSops || pIfMan->pPars->nGateSize > 0 ) 
        {
            // transform truth table into the SOP
            int RetValue = Kit_TruthIsop( If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), vCover, 1 );
            assert( RetValue == 0 || RetValue == 1 );
            // check the case of constant cover
            if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
            {
                assert( RetValue == 0 );
                pNodeNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, If_CutLeaveNum(pCutBest), NULL );
                pNodeNew = (Vec_IntSize(vCover) == 0) ? Abc_NtkCreateNodeConst0(pNtkNew) : Abc_NtkCreateNodeConst1(pNtkNew);
            }
            else
            {
                // derive the AIG for that tree
                pNodeNew->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtkNew->pManFunc, If_CutLeaveNum(pCutBest), vCover );
                if ( RetValue )
                    Abc_SopComplement( (char *)pNodeNew->pData );
            }
        }
        else if ( pIfMan->pPars->fDelayOpt )
            pNodeNew->pData = Abc_NodeBuildFromMini( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, 0 );
        else if ( pIfMan->pPars->fDsdBalance )
            pNodeNew->pData = Abc_NodeBuildFromMini( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, 1 );
        else if ( pIfMan->pPars->fUserRecLib )
        {
            extern Hop_Obj_t * Abc_RecToHop3( Hop_Man_t * pMan, If_Man_t * pIfMan, If_Cut_t * pCut, If_Obj_t * pIfObj );
            pNodeNew->pData = Abc_RecToHop3( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, pIfObj ); 
        }
        else
        {
            extern Hop_Obj_t * Kit_TruthToHop( Hop_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory );
            word * pTruth = If_CutTruthW(pIfMan, pCutBest);
            if ( pIfMan->pPars->fUseTtPerm )
                for ( i = 0; i < (int)pCutBest->nLeaves; i++ )
                    if ( If_CutLeafBit(pCutBest, i) )
                        Abc_TtFlip( pTruth, Abc_TtWordNum(pCutBest->nLeaves), i );
            pNodeNew->pData = Kit_TruthToHop( (Hop_Man_t *)pNtkNew->pManFunc, (unsigned *)pTruth, If_CutLeaveNum(pCutBest), vCover );
//            if ( pIfMan->pPars->fUseBat )
//                Bat_ManFuncPrintCell( *pTruth );
        }
        // complement the node if the cut was complemented
        if ( pCutBest->fCompl && !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDsdBalance )
            Abc_NodeComplement( pNodeNew );
    }
    else
    {
        pNodeNew->pData = Abc_NodeIfToHop( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pIfObj );
    }
    If_ObjSetCopy( pIfObj, pNodeNew );
    return pNodeNew;
}